

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O1

void __thiscall QRadioButton::mouseMoveEvent(QRadioButton *this,QMouseEvent *e)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  undefined4 uVar5;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar3 = QWidget::testAttribute_helper((QWidget *)this,WA_Hover);
  if (bVar3) {
    bVar4 = 0;
    if ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 2) != 0) {
      uVar5 = QEventPoint::position();
      auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM1_Qa;
      auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM0_Qa;
      auVar7 = minpd(_DAT_0066f5d0,auVar7);
      auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
      auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
      movmskpd(uVar5,auVar6);
      bVar4 = (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1a0))(this);
    }
    if (bVar4 != (*(byte *)(lVar2 + 0x2b4) & 1)) {
      QWidget::update((QWidget *)this);
      *(byte *)(lVar2 + 0x2b4) = *(byte *)(lVar2 + 0x2b4) & 0xfe | bVar4;
    }
  }
  QAbstractButton::mouseMoveEvent(&this->super_QAbstractButton,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRadioButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QRadioButton);
    if (testAttribute(Qt::WA_Hover)) {
        bool hit = false;
        if (underMouse())
            hit = hitButton(e->position().toPoint());

        if (hit != d->hovering) {
            update();
            d->hovering = hit;
        }
    }

    QAbstractButton::mouseMoveEvent(e);
}